

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactor.h
# Opt level: O0

void __thiscall HFactor::clinkDel(HFactor *this,HighsInt index)

{
  int iVar1;
  int iVar2;
  reference pvVar3;
  int in_ESI;
  long in_RDI;
  HighsInt xnext;
  HighsInt xlast;
  
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x408),(long)in_ESI);
  iVar1 = *pvVar3;
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x3f0),(long)in_ESI);
  iVar2 = *pvVar3;
  if (iVar1 < 0) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x3d8),(long)(-2 - iVar1));
    *pvVar3 = iVar2;
  }
  else {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x3f0),(long)iVar1);
    *pvVar3 = iVar2;
  }
  if (-1 < iVar2) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x408),(long)iVar2);
    *pvVar3 = iVar1;
  }
  return;
}

Assistant:

void clinkDel(const HighsInt index) {
    const HighsInt xlast = col_link_last[index];
    const HighsInt xnext = col_link_next[index];
    if (xlast >= 0)
      col_link_next[xlast] = xnext;
    else
      col_link_first[-xlast - 2] = xnext;
    if (xnext >= 0) col_link_last[xnext] = xlast;
  }